

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int evp_keyex_exchange(ptls_key_exchange_algorithm_t *algo,ptls_iovec_t *outpubkey,
                      ptls_iovec_t *secret,ptls_iovec_t peerkey)

{
  size_t __size;
  st_evp_keyex_context_t *psVar1;
  int iVar2;
  uint8_t *__dest;
  ptls_key_exchange_context_t *ctx;
  st_evp_keyex_context_t *local_38;
  
  local_38 = (st_evp_keyex_context_t *)0x0;
  outpubkey->base = (uint8_t *)0x0;
  outpubkey->len = 0;
  iVar2 = evp_keyex_create(algo,(ptls_key_exchange_context_t **)&local_38);
  psVar1 = local_38;
  if (iVar2 == 0) {
    __size = (local_38->super).pubkey.len;
    __dest = (uint8_t *)malloc(__size);
    outpubkey->base = __dest;
    if (__dest == (uint8_t *)0x0) {
      iVar2 = 0x201;
    }
    else {
      memcpy(__dest,(psVar1->super).pubkey.base,__size);
      outpubkey->len = (psVar1->super).pubkey.len;
      iVar2 = evp_keyex_on_exchange((ptls_key_exchange_context_t **)&local_38,1,secret,peerkey);
      if (local_38 != (st_evp_keyex_context_t *)0x0) {
        __assert_fail("ctx == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/openssl.c"
                      ,0x2ba,
                      "int evp_keyex_exchange(ptls_key_exchange_algorithm_t *, ptls_iovec_t *, ptls_iovec_t *, ptls_iovec_t)"
                     );
      }
    }
  }
  if (local_38 != (st_evp_keyex_context_t *)0x0) {
    evp_keyex_free(local_38);
    local_38 = (st_evp_keyex_context_t *)0x0;
  }
  if (iVar2 != 0) {
    free(outpubkey->base);
    outpubkey->base = (uint8_t *)0x0;
    outpubkey->len = 0;
  }
  return iVar2;
}

Assistant:

static int evp_keyex_exchange(ptls_key_exchange_algorithm_t *algo, ptls_iovec_t *outpubkey, ptls_iovec_t *secret,
                              ptls_iovec_t peerkey)
{
    ptls_key_exchange_context_t *ctx = NULL;
    int ret;

    *outpubkey = ptls_iovec_init(NULL, 0);

    if ((ret = evp_keyex_create(algo, &ctx)) != 0)
        goto Exit;
    if ((outpubkey->base = malloc(ctx->pubkey.len)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    memcpy(outpubkey->base, ctx->pubkey.base, ctx->pubkey.len);
    outpubkey->len = ctx->pubkey.len;
    ret = evp_keyex_on_exchange(&ctx, 1, secret, peerkey);
    assert(ctx == NULL);

Exit:
    if (ctx != NULL)
        evp_keyex_on_exchange(&ctx, 1, NULL, ptls_iovec_init(NULL, 0));
    if (ret != 0) {
        free(outpubkey->base);
        *outpubkey = ptls_iovec_init(NULL, 0);
    }
    return ret;
}